

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_alloter.cpp
# Opt level: O2

void * __thiscall cppnet::PoolAlloter::Malloc(PoolAlloter *this,uint32_t size)

{
  pointer ppMVar1;
  MemNode *pMVar2;
  int iVar3;
  undefined4 extraout_var;
  void *pvVar4;
  uint uVar5;
  
  if (0x100 < size) {
    iVar3 = (*((this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_Alloter[2])();
    return (void *)CONCAT44(extraout_var,iVar3);
  }
  uVar5 = (size + 7 >> 3) - 1;
  ppMVar1 = (this->_free_list).
            super__Vector_base<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = ppMVar1[uVar5];
  if (pMVar2 != (MemNode *)0x0) {
    *(MemNode *)(ppMVar1 + uVar5) = *pMVar2;
    return pMVar2;
  }
  pvVar4 = ReFill(this,size + 7 & 0x3f8,0x14);
  return pvVar4;
}

Assistant:

void* PoolAlloter::Malloc(uint32_t size) {
    if (size > __default_max_bytes) {
        void* ret = _alloter->Malloc(size);
        return ret;
    }
#ifdef __use_iocp__
    std::lock_guard<std::mutex> lock(_mutex);
#endif
    MemNode** my_free = &(_free_list[FreeListIndex(size)]);
    MemNode* result = *my_free;
    if (result == nullptr) {
        void* bytes = ReFill(Align(size));
        return bytes;
    }
    
    *my_free = result->_next;
    return result;
}